

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffer_builder.h
# Opt level: O0

uint __thiscall
flatbuffers::FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
          (FlatBufferBuilderImpl<false> *this,unsigned_short element)

{
  type tVar1;
  unsigned_short local_14;
  unsigned_short local_12;
  FlatBufferBuilderImpl<false> *pFStack_10;
  unsigned_short element_local;
  FlatBufferBuilderImpl<false> *this_local;
  
  local_12 = element;
  pFStack_10 = this;
  AssertScalarT<unsigned_short>(this);
  Align(this,2);
  local_14 = EndianScalar<unsigned_short>(local_12);
  vector_downward<unsigned_int>::push_small<unsigned_short>(&this->buf_,&local_14);
  tVar1 = CalculateOffset<unsigned_int>(this);
  return tVar1;
}

Assistant:

ReturnT PushElement(T element) {
    AssertScalarT<T>();
    Align(sizeof(T));
    buf_.push_small(EndianScalar(element));
    return CalculateOffset<ReturnT>();
  }